

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall cmFindPackageCommand::FindAppBundleConfig(cmFindPackageCommand *this)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  string *prefix_in;
  string *p;
  
  psVar1 = (this->super_cmFindCommon).SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (this->super_cmFindCommon).SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    prefix_in = psVar2;
    if (prefix_in == psVar1) break;
    bVar3 = SearchAppBundlePrefix(this,prefix_in);
    psVar2 = prefix_in + 1;
  } while (!bVar3);
  return prefix_in != psVar1;
}

Assistant:

bool cmFindPackageCommand::FindAppBundleConfig()
{
  std::vector<std::string> const& prefixes = this->SearchPaths;
  for (std::string const& p : prefixes) {
    if (this->SearchAppBundlePrefix(p)) {
      return true;
    }
  }
  return false;
}